

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::LE_Fire_PDU::Decode(LE_Fire_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *this_01;
  int iVar2;
  EntityType local_68;
  unsigned_short local_58;
  undefined1 local_55;
  KUINT16 tmp;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  LE_Fire_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0;
  if ((local_19 & 1) != 0) {
    iVar2 = 0xc;
  }
  if (0x22 < (uint)KVar1 + iVar2) {
    LE_Header::Decode(&this->super_LE_Header,pKStack_18,(bool)(local_19 & 1));
    KDataStream::operator>>(pKStack_18,&(this->m_FireFlagUnion).m_ui8Flag);
    if (((this->m_FireFlagUnion).m_ui8Flag & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_TargetID).super_DataTypeBase);
    }
    local_58 = 0;
    if (((this->m_FireFlagUnion).m_ui8Flag >> 2 & 1) != 0) {
      if (((this->m_FireFlagUnion).m_ui8Flag >> 1 & 1) == 0) {
        DATA_TYPE::LE_EntityIdentifier::operator=
                  (&this->m_MunitionID,&(this->super_LE_Header).m_EntID);
        KDataStream::operator>>(pKStack_18,&local_58);
        DATA_TYPE::LE_EntityIdentifier::SetEntityID(&this->m_MunitionID,local_58);
      }
      else {
        DATA_TYPE::operator>>(pKStack_18,&(this->m_MunitionID).super_DataTypeBase);
      }
    }
    if (((this->m_FireFlagUnion).m_ui8Flag >> 3 & 1) == 0) {
      DATA_TYPE::LE_EntityIdentifier::operator=(&this->m_EventID,&(this->super_LE_Header).m_EntID);
      KDataStream::operator>>(pKStack_18,&local_58);
      DATA_TYPE::LE_EntityIdentifier::SetEntityID(&this->m_EventID,local_58);
    }
    else {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_EventID).super_DataTypeBase);
    }
    if (((this->m_FireFlagUnion).m_ui8Flag >> 6 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_Loc).super_DataTypeBase);
    }
    DATA_TYPE::EntityType::EntityType(&local_68,pKStack_18);
    DATA_TYPE::Descriptor::SetType(&(this->m_MunitionDesc).super_Descriptor,&local_68);
    DATA_TYPE::EntityType::~EntityType(&local_68);
    if (((this->m_FireFlagUnion).m_ui8Flag >> 4 & 1) != 0) {
      KDataStream::operator>>(pKStack_18,&local_58);
      DATA_TYPE::MunitionDescriptor::SetWarhead(&this->m_MunitionDesc,(uint)local_58);
      KDataStream::operator>>(pKStack_18,&local_58);
      DATA_TYPE::MunitionDescriptor::SetFuse(&this->m_MunitionDesc,(uint)local_58);
    }
    if (((this->m_FireFlagUnion).m_ui8Flag >> 5 & 1) != 0) {
      KDataStream::operator>>(pKStack_18,&local_58);
      DATA_TYPE::MunitionDescriptor::SetQuantity(&this->m_MunitionDesc,local_58);
      KDataStream::operator>>(pKStack_18,&local_58);
      DATA_TYPE::MunitionDescriptor::SetRate(&this->m_MunitionDesc,local_58);
    }
    this_01 = DATA_TYPE::operator>>(pKStack_18,&(this->m_Vel).super_DataTypeBase);
    KDataStream::operator>>(this_01,&this->m_ui16Range);
    return;
  }
  local_55 = 1;
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  local_55 = 0;
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LE_Fire_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < LE_FIRE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    LE_Header::Decode( stream, ignoreHeader );

    stream >> m_FireFlagUnion.m_ui8Flag;

    // F0: Target Entity ID
    if( m_FireFlagUnion.m_ui8TargetId )
    {
        stream >> KDIS_STREAM m_TargetID;
    }

    KUINT16 tmp = 0;

    // F2: Munition ID
    if( m_FireFlagUnion.m_ui8MunitionId )
    {
        // F1: Site Number and Application Number
        if( m_FireFlagUnion.m_ui8MunitionSiteApp )
        {
            stream >> KDIS_STREAM m_MunitionID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.

            // The Firing Entities site and application id are the same so lets copy them over
            m_MunitionID = m_EntID;

            stream >> tmp;
            m_MunitionID.SetEntityID( tmp );
        }
    }

    // F3: Event ID
    if( m_FireFlagUnion.m_ui8EventSiteAppId )
    {
        stream >> KDIS_STREAM m_EventID;
    }
    else
    {
        // We cant use the standard encode/decode functions here as not all fields are included.

        // The Firing Entities site and application id are the same so lets copy them over
        m_EventID = m_EntID;

        stream >> tmp;
        m_EventID.SetEntityID( tmp );
    }

    // F6: Location
    if( m_FireFlagUnion.m_ui8Location )
    {
        stream >> KDIS_STREAM m_Loc;
    }

    // Munition Descriptor
    m_MunitionDesc.SetType( EntityType( stream ) );
    // F4: Warhead and Fuse fields of the Munition Descriptor record
    if( m_FireFlagUnion.m_ui8WarheadFuse )
    {
        stream >> tmp;
        m_MunitionDesc.SetWarhead( ( WarheadType )tmp );

        stream >> tmp;
        m_MunitionDesc.SetFuse( ( FuseType )tmp );
    }
    // F5: Quantity and Rate fields of the Munition Descriptor record
    if( m_FireFlagUnion.m_ui8QuantRate )
    {
        stream >> tmp;
        m_MunitionDesc.SetQuantity( tmp );

        stream >> tmp;
        m_MunitionDesc.SetRate( tmp );
    }

    // Velocity and Range
    stream >> KDIS_STREAM m_Vel
           >> m_ui16Range;
}